

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLoc.cpp
# Opt level: O1

void __thiscall llvm::DWARFDebugLoc::parse(DWARFDebugLoc *this,DWARFDataExtractor *data)

{
  Twine ErrorBanner;
  undefined1 auVar1 [8];
  undefined1 uVar2;
  raw_ostream *OS;
  undefined1 local_d0 [8];
  Expected<llvm::DWARFDebugLoc::LocationList> LL;
  undefined8 uStack_58;
  undefined8 local_50;
  uint64_t local_48;
  uint64_t Offset;
  Error local_38;
  
  this->IsLittleEndian = (data->super_DataExtractor).IsLittleEndian != '\0';
  this->AddressSize = (uint)(data->super_DataExtractor).AddressSize;
  local_48 = 0;
  Offset = (uint64_t)data;
  do {
    if ((data->super_DataExtractor).Data.Length <= local_48) {
      return;
    }
    parseOneLocationList
              ((Expected<llvm::DWARFDebugLoc::LocationList> *)local_d0,this,data,&local_48);
    uVar2 = LL.field_0.TStorage.buffer[0x60];
    auVar1 = local_d0;
    if ((LL.field_0.TStorage.buffer[0x60] & 1U) == 0) {
      SmallVectorTemplateBase<llvm::DWARFDebugLoc::LocationList,_false>::push_back
                ((SmallVectorTemplateBase<llvm::DWARFDebugLoc::LocationList,_false> *)this,
                 (LocationList *)local_d0);
    }
    else {
      local_d0 = (undefined1  [8])0x0;
      local_38.Payload = (ErrorInfoBase *)((ulong)auVar1 | 1);
      OS = WithColor::error();
      Twine::Twine((Twine *)&LL.field_0x68);
      ErrorBanner.RHS = (Child)uStack_58;
      ErrorBanner.LHS = (Child)LL._104_8_;
      ErrorBanner._16_8_ = local_50;
      logAllUnhandledErrors(&local_38,OS,ErrorBanner);
      data = (DWARFDataExtractor *)Offset;
      if ((long *)((ulong)local_38.Payload & 0xfffffffffffffffe) != (long *)0x0) {
        (**(code **)(*(long *)((ulong)local_38.Payload & 0xfffffffffffffffe) + 8))();
      }
    }
    Expected<llvm::DWARFDebugLoc::LocationList>::~Expected
              ((Expected<llvm::DWARFDebugLoc::LocationList> *)local_d0);
  } while ((uVar2 & 1) == 0);
  return;
}

Assistant:

void DWARFDebugLoc::parse(const DWARFDataExtractor &data) {
  IsLittleEndian = data.isLittleEndian();
  AddressSize = data.getAddressSize();

  uint64_t Offset = 0;
  while (Offset < data.getData().size()) {
    if (auto LL = parseOneLocationList(data, &Offset))
      Locations.push_back(std::move(*LL));
    else {
      logAllUnhandledErrors(LL.takeError(), WithColor::error());
      break;
    }
  }
}